

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t propertyNameLength;
  BOOL BVar3;
  undefined4 *puVar4;
  char16 *propertyName;
  RecyclableObject *pRVar5;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  PathTypeHandlerWithAttr *local_48;
  PropertyValueInfo *local_40;
  Var *local_38;
  
  propertyRecord = (PropertyRecord *)originalInstance;
  local_48 = this;
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xefa,"(requestContext)","requestContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_40 = info;
  local_38 = value;
  propertyName = JavascriptString::GetString(propertyNameString);
  propertyNameLength = JavascriptString::GetLength(propertyNameString);
  bVar2 = DynamicObject::HasObjectArray(instance);
  if (bVar2) {
    ScriptContext::GetOrAddPropertyRecord(requestContext,propertyName,propertyNameLength,&local_58);
  }
  else {
    ScriptContext::FindPropertyRecord(requestContext,propertyName,propertyNameLength,&local_58);
    if (local_58 == (PropertyRecord *)0x0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      *local_38 = pRVar5;
      return 0;
    }
  }
  BVar3 = GetProperty(local_48,instance,propertyRecord,local_58->pid,local_38,local_40,
                      requestContext);
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Consider: Implement actual string hash lookup
        Assert(requestContext);
        PropertyRecord const* propertyRecord;
        char16 const * propertyName = propertyNameString->GetString();
        charcount_t const propertyNameLength = propertyNameString->GetLength();

        if (instance->HasObjectArray())
        {
            requestContext->GetOrAddPropertyRecord(propertyName, propertyNameLength, &propertyRecord);
        }
        else
        {
            requestContext->FindPropertyRecord(propertyName, propertyNameLength, &propertyRecord);
            if (propertyRecord == nullptr)
            {
                *value = requestContext->GetMissingPropertyResult();
                return false;
            }
        }
        return PathTypeHandlerWithAttr::GetProperty(instance, originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }